

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

bool __thiscall Rml::DataViewChecked::Update(DataViewChecked *this,DataModel *model)

{
  bool bVar1;
  bool bVar2;
  Element *element;
  DataExpression *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  String value;
  Variant variant;
  DataExpressionInterface expr_interface;
  allocator<char> local_102;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  Variant local_c0;
  Dictionary local_98;
  String local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  DataExpressionInterface local_38;
  
  Variant::Variant(&local_c0);
  element = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface(&local_38,model,element,(Event *)0x0);
  if (element != (Element *)0x0) {
    this_00 = DataViewCommon::GetExpression(&this->super_DataViewCommon);
    bVar1 = DataExpression::Run(this_00,&local_38,&local_c0);
    if (bVar1) {
      if (local_c0.type == BOOL) {
        bVar1 = Variant::Get<bool>(&local_c0,false);
      }
      else {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        Variant::Get<std::__cxx11::string>(&local_100,&local_c0,&local_58);
        ::std::__cxx11::string::~string((string *)&local_58);
        if (local_100._M_string_length == 0) {
          bVar1 = false;
        }
        else {
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"value",&local_101);
          ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_102);
          Get<std::__cxx11::string>(&local_e0,(Rml *)&element->attributes,&local_98,&local_78,in_R8)
          ;
          bVar1 = ::std::operator==(&local_100,&local_e0);
          ::std::__cxx11::string::~string((string *)&local_e0);
          ::std::__cxx11::string::~string((string *)&local_78);
          ::std::__cxx11::string::~string((string *)&local_98);
        }
        ::std::__cxx11::string::~string((string *)&local_100);
      }
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"checked",(allocator<char> *)&local_e0);
      bVar2 = Element::HasAttribute(element,&local_100);
      ::std::__cxx11::string::~string((string *)&local_100);
      if (bVar1 != bVar2) {
        if (bVar1 == false) {
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,"checked",(allocator<char> *)&local_e0);
          Element::RemoveAttribute(element,&local_100);
        }
        else {
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,"checked",(allocator<char> *)&local_98);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          local_e0._M_string_length = 0;
          local_e0.field_2._M_local_buf[0] = '\0';
          Element::SetAttribute<std::__cxx11::string>(element,&local_100,&local_e0);
          ::std::__cxx11::string::~string((string *)&local_e0);
        }
        ::std::__cxx11::string::~string((string *)&local_100);
        bVar1 = true;
        goto LAB_0026e940;
      }
    }
  }
  bVar1 = false;
LAB_0026e940:
  Variant::~Variant(&local_c0);
  return bVar1;
}

Assistant:

bool DataViewChecked::Update(DataModel& model)
{
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		bool new_checked_state = false;

		if (variant.GetType() == Variant::BOOL)
		{
			new_checked_state = variant.Get<bool>();
		}
		else
		{
			const String value = variant.Get<String>();
			new_checked_state = (!value.empty() && value == element->GetAttribute<String>("value", ""));
		}

		const bool current_checked_state = element->HasAttribute("checked");

		if (new_checked_state != current_checked_state)
		{
			result = true;
			if (new_checked_state)
				element->SetAttribute("checked", String());
			else
				element->RemoveAttribute("checked");
		}
	}

	return result;
}